

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

long xmlByteConsumed(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlCharEncodingHandler *handler;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  xmlChar *pxVar5;
  int toconv;
  int written;
  uchar convbuf [32000];
  int local_7d40;
  int local_7d3c;
  uchar local_7d38 [32008];
  
  pxVar5 = (xmlChar *)0xffffffffffffffff;
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (pxVar1 = ctxt->input, pxVar1 != (xmlParserInputPtr)0x0)) {
    if ((pxVar1->buf == (xmlParserInputBufferPtr)0x0) ||
       (handler = pxVar1->buf->encoder, handler == (xmlCharEncodingHandler *)0x0)) {
      pxVar5 = pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base);
    }
    else {
      if (pxVar1->end == pxVar1->cur || (long)pxVar1->end - (long)pxVar1->cur < 0) {
        uVar4 = 0;
      }
      else {
        pxVar5 = pxVar1->cur;
        uVar4 = 0;
        do {
          local_7d40 = *(int *)&pxVar1->end - (int)pxVar5;
          local_7d3c = 32000;
          iVar3 = xmlEncOutputChunk(handler,local_7d38,&local_7d3c,pxVar5,&local_7d40);
          if (local_7d3c < 1 && iVar3 < 0) break;
          uVar4 = uVar4 + local_7d3c;
          pxVar5 = pxVar5 + local_7d40;
        } while (iVar3 < 0);
        if (local_7d3c < 1 && iVar3 < 0) {
          return -1;
        }
      }
      uVar2 = pxVar1->buf->rawconsumed;
      pxVar5 = (xmlChar *)0xffffffffffffffff;
      if (uVar4 <= uVar2) {
        pxVar5 = (xmlChar *)(uVar2 - uVar4);
      }
    }
  }
  return (long)pxVar5;
}

Assistant:

long
xmlByteConsumed(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in;

    if (ctxt == NULL) return(-1);
    in = ctxt->input;
    if (in == NULL)  return(-1);
    if ((in->buf != NULL) && (in->buf->encoder != NULL)) {
        unsigned int unused = 0;
	xmlCharEncodingHandler * handler = in->buf->encoder;
        /*
	 * Encoding conversion, compute the number of unused original
	 * bytes from the input not consumed and subtract that from
	 * the raw consumed value, this is not a cheap operation
	 */
        if (in->end - in->cur > 0) {
	    unsigned char convbuf[32000];
	    const unsigned char *cur = (const unsigned char *)in->cur;
	    int toconv = in->end - in->cur, written = 32000;

	    int ret;

            do {
                toconv = in->end - cur;
                written = 32000;
                ret = xmlEncOutputChunk(handler, &convbuf[0], &written,
                                        cur, &toconv);
                if (ret < 0) {
                    if (written > 0)
                        ret = -2;
                    else
                        return(-1);
                }
                unused += written;
                cur += toconv;
            } while (ret == -2);
	}
	if (in->buf->rawconsumed < unused)
	    return(-1);
	return(in->buf->rawconsumed - unused);
    }
    return(in->consumed + (in->cur - in->base));
}